

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.hpp
# Opt level: O0

float __thiscall
re::beatnik::tracker<float,_256L,_4L>::estimate_period(tracker<float,_256L,_4L> *this)

{
  reference plVar1;
  float local_78;
  float local_74;
  float periods_count;
  float periods_sum;
  int_t last_beat;
  reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> local_58;
  undefined1 local_48 [32];
  undefined1 local_28 [24];
  int_t max_index;
  tracker<float,_256L,_4L> *this_local;
  
  this->counter = 0;
  max_index = (int_t)this;
  ::std::crbegin<re::ring_array<float,1024ul>>((ring_array<float,_1024UL> *)local_28);
  ::std::crbegin<re::ring_array<float,1024ul>>((ring_array<float,_1024UL> *)local_48);
  ::std::crbegin<re::ring_array<float,1024ul>>((ring_array<float,_1024UL> *)&last_beat);
  std::reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_>::operator+
            (&local_58,(difference_type)&last_beat);
  ::std::max_element<std::reverse_iterator<re::indexed_iterator<re::ring_array<float,1024ul>,true>>>
            ((reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> *)
             (local_48 + 0x10),
             (reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> *)
             local_48);
  local_28._16_8_ =
       ::std::
       distance<std::reverse_iterator<re::indexed_iterator<re::ring_array<float,1024ul>,true>>>
                 ((reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_> *)
                  local_28,(reverse_iterator<re::indexed_iterator<re::ring_array<float,_1024UL>,_true>_>
                            *)(local_48 + 0x10));
  _periods_count = 0x3ff - local_28._16_8_;
  local_74 = 0.0;
  local_78 = 0.0;
  while ((plVar1 = ring_array<long,_1024UL>::operator[](&this->backlink,_periods_count),
         *plVar1 < (long)_periods_count &&
         (plVar1 = ring_array<long,_1024UL>::operator[](&this->backlink,_periods_count),
         *plVar1 != 0))) {
    plVar1 = ring_array<long,_1024UL>::operator[](&this->backlink,_periods_count);
    local_74 = (float)*plVar1 + local_74;
    local_78 = local_78 + 1.0;
    plVar1 = ring_array<long,_1024UL>::operator[](&this->backlink,_periods_count);
    _periods_count = _periods_count - *plVar1;
  }
  return local_74 / local_78;
}

Assistant:

T
    estimate_period() noexcept
    {
        counter = 0;

        auto max_index = static_cast<int_t>(
            std::distance(
                std::crbegin(cumulative_score),
                std::max_element(
                    std::crbegin(cumulative_score),
                    std::crbegin(cumulative_score) + period_guess
                )
            )
        );
        auto last_beat = N - max_index - 1;

        T periods_sum = 0;
        T periods_count = 0;

        // jump in reverse from a beat to another
        while (last_beat > backlink[last_beat]) {
            if (backlink[last_beat] == 0) break; // JIC
            periods_sum += backlink[last_beat];
            periods_count++;
            last_beat -= backlink[last_beat];
        }

        return periods_sum / periods_count;
    }